

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O1

int sc_core::sc_report_handler::stop_after(char *msg_type_,int limit)

{
  uint uVar1;
  sc_msg_def *psVar2;
  uint uVar3;
  
  psVar2 = mdlookup(msg_type_);
  if (psVar2 == (sc_msg_def *)0x0) {
    psVar2 = add_msg_type(msg_type_);
  }
  uVar1 = psVar2->limit_mask;
  uVar3 = 0xffffffff;
  if ((uVar1 & 1) != 0) {
    uVar3 = psVar2->limit;
  }
  if (limit < 0) {
    psVar2->limit_mask = uVar1 & 0xfffffffe;
  }
  else {
    psVar2->limit_mask = uVar1 | 1;
    psVar2->limit = limit;
  }
  return uVar3;
}

Assistant:

int sc_report_handler::stop_after(const char * msg_type_, int limit)
{
    sc_msg_def * md = mdlookup(msg_type_);

    if ( !md )
	md = add_msg_type(msg_type_);

    int old = md->limit_mask & 1 ? md->limit: UINT_MAX;

    if ( limit < 0 )
	md->limit_mask &= ~1;
    else
    {
	md->limit_mask |= 1;
	md->limit = limit;
    }
    return old;
}